

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O2

void __thiscall Liby::Buffer::forward(Buffer *this,off_t offset)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  size_t __n;
  off_t oVar4;
  off_t oVar5;
  undefined1 auVar6 [16];
  
  if (offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xa2,"void Liby::Buffer::forward(off_t)");
  }
  if (offset == 0) {
    lVar1 = this->leftIndex_;
    if (lVar1 != 0) {
      pcVar2 = this->buffer_;
      __n = size(this);
      memmove(pcVar2,pcVar2 + lVar1,__n);
      this->rightIndex_ = this->rightIndex_ - this->leftIndex_;
      this->leftIndex_ = 0;
    }
  }
  else {
    lVar1 = this->rightIndex_;
    if (lVar1 - offset == 0 || lVar1 < offset) {
      oVar4 = 0;
      oVar5 = 0;
    }
    else {
      pcVar2 = this->buffer_;
      lVar3 = this->leftIndex_;
      if (lVar3 < offset) {
        memmove(pcVar2,pcVar2 + -offset + lVar1,lVar1 - offset);
        this->leftIndex_ = 0;
        this->rightIndex_ = this->rightIndex_ - offset;
        return;
      }
      memmove(pcVar2 + lVar3 + -offset,pcVar2 + lVar3,lVar1 - lVar3);
      auVar6._8_4_ = (int)offset;
      auVar6._0_8_ = offset;
      auVar6._12_4_ = (int)((ulong)offset >> 0x20);
      oVar4 = this->leftIndex_ - offset;
      oVar5 = this->rightIndex_ - auVar6._8_8_;
    }
    this->leftIndex_ = oVar4;
    this->rightIndex_ = oVar5;
  }
  return;
}

Assistant:

void Buffer::forward(off_t offset) {
    assert(offset >= 0);
    if (offset == 0) {
        if (leftIndex_ == 0) {
            return;
        }
        ::memmove(buffer_, buffer_ + leftIndex_, size());
        rightIndex_ -= leftIndex_;
        leftIndex_ = 0;
    } else if (offset >= rightIndex_) {
        leftIndex_ = rightIndex_ = 0;
    } else if (offset <= leftIndex_) {
        ::memmove(buffer_ + leftIndex_ - offset, buffer_ + leftIndex_,
                  rightIndex_ - leftIndex_);
        leftIndex_ -= offset;
        rightIndex_ -= offset;
    } else {
        ::memmove(buffer_, buffer_ + rightIndex_ - offset,
                  rightIndex_ - offset);
        leftIndex_ = 0;
        rightIndex_ -= offset;
    }
}